

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  int *piVar1;
  ImVector<ImDrawList_*> *pIVar2;
  ImDrawList **ppIVar3;
  bool bVar4;
  ImDrawList **__dest;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    pIVar2 = this->Layers + lVar5;
    if (this->Layers[lVar5].Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImDrawList **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      if (pIVar2->Data != (ImDrawList **)0x0) {
        memcpy(__dest,pIVar2->Data,(long)pIVar2->Size << 3);
        ppIVar3 = pIVar2->Data;
        if ((ppIVar3 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      pIVar2->Data = __dest;
      pIVar2->Capacity = 0;
    }
    pIVar2->Size = 0;
    lVar5 = 1;
    bVar4 = false;
  } while (bVar6);
  return;
}

Assistant:

void Clear()            { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }